

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_compiler.c
# Opt level: O0

void require_integer_datatype(Context_conflict *ctx,MOJOSHADER_astDataType *datatype)

{
  MOJOSHADER_astDataType *pMVar1;
  MOJOSHADER_astDataType *datatype_local;
  Context_conflict *ctx_local;
  
  pMVar1 = reduce_datatype(ctx,datatype);
  if (pMVar1->type != MOJOSHADER_AST_DATATYPE_INT && pMVar1->type != MOJOSHADER_AST_DATATYPE_UINT) {
    fail(ctx,"Expected integer type");
  }
  return;
}

Assistant:

static void require_integer_datatype(Context *ctx,
                                     const MOJOSHADER_astDataType *datatype)
{
    datatype = reduce_datatype(ctx, datatype);
    switch (datatype->type)
    {
        case MOJOSHADER_AST_DATATYPE_INT:
        case MOJOSHADER_AST_DATATYPE_UINT:
            return;
        default: break;
    } // switch

    fail(ctx, "Expected integer type");  // !!! FIXME: fmt.
    // !!! FIXME: replace AST node with an AST_OP_INT_LITERAL zero, keep going.
}